

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderLibraryCase.cpp
# Opt level: O1

void deqp::sl::genCompareOp
               (ostringstream *output,char *dstVec4Var,ValueBlock *valueBlock,
               char *nonFloatNamePrefix,char *checkVarName)

{
  int iVar1;
  bool bVar2;
  DataType DVar3;
  size_t sVar4;
  long lVar5;
  pointer pVVar6;
  char *pcVar7;
  long lVar8;
  long lVar9;
  
  pVVar6 = (valueBlock->values).
           super__Vector_base<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
           ._M_impl.super__Vector_impl_data._M_start;
  iVar1 = (int)output;
  if (0 < (int)((ulong)((long)(valueBlock->values).
                              super__Vector_base<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar6) >> 3) *
          0x38e38e39) {
    bVar2 = true;
    lVar8 = 0;
    lVar9 = 0;
    do {
      if (*(int *)((long)&pVVar6->storageType + lVar8) == 2) {
        pcVar7 = *(char **)((long)&(pVVar6->valueName)._M_dataplus._M_p + lVar8);
        if (bVar2) {
          std::__ostream_insert<char,std::char_traits<char>>
                    (&output->super_basic_ostream<char,_std::char_traits<char>_>,"bool RES = ",0xb);
          bVar2 = false;
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    (&output->super_basic_ostream<char,_std::char_traits<char>_>,"RES = RES && ",0xd
                    );
        }
        DVar3 = glu::getDataTypeScalarType(*(DataType *)((long)&pVVar6->dataType + lVar8));
        std::__ostream_insert<char,std::char_traits<char>>
                  (&output->super_basic_ostream<char,_std::char_traits<char>_>,"isOk(",5);
        if (DVar3 == TYPE_FLOAT) {
          if (pcVar7 == (char *)0x0) {
            std::ios::clear(iVar1 + (int)(output->super_basic_ostream<char,_std::char_traits<char>_>
                                         )._vptr_basic_ostream[-3]);
          }
          else {
            sVar4 = strlen(pcVar7);
            std::__ostream_insert<char,std::char_traits<char>>
                      (&output->super_basic_ostream<char,_std::char_traits<char>_>,pcVar7,sVar4);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    (&output->super_basic_ostream<char,_std::char_traits<char>_>,", ref_",6);
          if (pcVar7 == (char *)0x0) {
            std::ios::clear(iVar1 + (int)(output->super_basic_ostream<char,_std::char_traits<char>_>
                                         )._vptr_basic_ostream[-3]);
          }
          else {
            sVar4 = strlen(pcVar7);
            std::__ostream_insert<char,std::char_traits<char>>
                      (&output->super_basic_ostream<char,_std::char_traits<char>_>,pcVar7,sVar4);
          }
          lVar5 = 9;
          pcVar7 = ", 0.05);\n";
        }
        else {
          if (nonFloatNamePrefix == (char *)0x0) {
            std::ios::clear(iVar1 + (int)(output->super_basic_ostream<char,_std::char_traits<char>_>
                                         )._vptr_basic_ostream[-3]);
          }
          else {
            sVar4 = strlen(nonFloatNamePrefix);
            std::__ostream_insert<char,std::char_traits<char>>
                      (&output->super_basic_ostream<char,_std::char_traits<char>_>,
                       nonFloatNamePrefix,sVar4);
          }
          if (pcVar7 == (char *)0x0) {
            std::ios::clear(iVar1 + (int)(output->super_basic_ostream<char,_std::char_traits<char>_>
                                         )._vptr_basic_ostream[-3]);
          }
          else {
            sVar4 = strlen(pcVar7);
            std::__ostream_insert<char,std::char_traits<char>>
                      (&output->super_basic_ostream<char,_std::char_traits<char>_>,pcVar7,sVar4);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    (&output->super_basic_ostream<char,_std::char_traits<char>_>,", ref_",6);
          if (pcVar7 == (char *)0x0) {
            std::ios::clear(iVar1 + (int)(output->super_basic_ostream<char,_std::char_traits<char>_>
                                         )._vptr_basic_ostream[-3]);
          }
          else {
            sVar4 = strlen(pcVar7);
            std::__ostream_insert<char,std::char_traits<char>>
                      (&output->super_basic_ostream<char,_std::char_traits<char>_>,pcVar7,sVar4);
          }
          lVar5 = 3;
          pcVar7 = ");\n";
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  (&output->super_basic_ostream<char,_std::char_traits<char>_>,pcVar7,lVar5);
      }
      lVar9 = lVar9 + 1;
      pVVar6 = (valueBlock->values).
               super__Vector_base<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar8 = lVar8 + 0x48;
    } while (lVar9 < (int)((ulong)((long)(valueBlock->values).
                                         super__Vector_base<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar6)
                          >> 3) * 0x38e38e39);
    if (!bVar2) {
      if (dstVec4Var == (char *)0x0) {
        std::ios::clear(iVar1 + (int)(output->super_basic_ostream<char,_std::char_traits<char>_>).
                                     _vptr_basic_ostream[-3]);
      }
      else {
        sVar4 = strlen(dstVec4Var);
        std::__ostream_insert<char,std::char_traits<char>>
                  (&output->super_basic_ostream<char,_std::char_traits<char>_>,dstVec4Var,sVar4);
      }
      pcVar7 = " = vec4(RES, RES, RES, 1.0);\n";
      lVar8 = 0x1d;
      goto LAB_00db0620;
    }
  }
  if (dstVec4Var == (char *)0x0) {
    std::ios::clear(iVar1 + (int)(output->super_basic_ostream<char,_std::char_traits<char>_>).
                                 _vptr_basic_ostream[-3]);
  }
  else {
    sVar4 = strlen(dstVec4Var);
    std::__ostream_insert<char,std::char_traits<char>>
              (&output->super_basic_ostream<char,_std::char_traits<char>_>,dstVec4Var,sVar4);
  }
  pcVar7 = " = vec4(1.0);\n";
  lVar8 = 0xe;
LAB_00db0620:
  std::__ostream_insert<char,std::char_traits<char>>
            (&output->super_basic_ostream<char,_std::char_traits<char>_>,pcVar7,lVar8);
  return;
}

Assistant:

static void genCompareOp(ostringstream& output, const char* dstVec4Var, const ShaderCase::ValueBlock& valueBlock,
						 const char* nonFloatNamePrefix, const char* checkVarName)
{
	bool isFirstOutput = true;

	for (int ndx = 0; ndx < (int)valueBlock.values.size(); ndx++)
	{
		const ShaderCase::Value& val	   = valueBlock.values[ndx];
		const char*				 valueName = val.valueName.c_str();

		if (val.storageType == ShaderCase::Value::STORAGE_OUTPUT)
		{
			// Check if we're only interested in one variable (then skip if not the right one).
			if (checkVarName && !deStringEqual(valueName, checkVarName))
				continue;

			// Prefix.
			if (isFirstOutput)
			{
				output << "bool RES = ";
				isFirstOutput = false;
			}
			else
				output << "RES = RES && ";

			// Generate actual comparison.
			if (getDataTypeScalarType(val.dataType) == TYPE_FLOAT)
				output << "isOk(" << valueName << ", ref_" << valueName << ", 0.05);\n";
			else
				output << "isOk(" << nonFloatNamePrefix << valueName << ", ref_" << valueName << ");\n";
		}
		// \note Uniforms are already declared in shader.
	}

	if (isFirstOutput)
		output << dstVec4Var << " = vec4(1.0);\n"; // \todo [petri] Should we give warning if not expect-failure case?
	else
		output << dstVec4Var << " = vec4(RES, RES, RES, 1.0);\n";
}